

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O1

void oprop_id(long oprop,obj *otmp,obj *ostack,obj *olaunch)

{
  char cVar1;
  
  if ((otmp->oprops & oprop) == 0) {
    if ((otmp->oclass == '\r') || (otmp->oclass == '\x02')) {
      cVar1 = objects[otmp->otyp].oc_subtyp;
      if (((-0x19 < cVar1) &&
          (((olaunch != (obj *)0x0 && (cVar1 < -0x15)) &&
           ((int)cVar1 + (int)objects[olaunch->otyp].oc_subtyp == 0)))) &&
         (ostack = olaunch, (olaunch->oprops & oprop) != 0)) goto LAB_0014a592;
    }
  }
  else {
    otmp->oprops_known = otmp->oprops_known | oprop;
    if (ostack != (obj *)0x0) {
LAB_0014a592:
      ostack->oprops_known = ostack->oprops_known | oprop;
      return;
    }
  }
  return;
}

Assistant:

void oprop_id(long oprop, struct obj *otmp, struct obj *ostack, struct obj *olaunch)
{
	if ((otmp->oprops & oprop)) {
	    otmp->oprops_known |= oprop;
	    if (ostack)
		ostack->oprops_known |= oprop;
	} else if (ammo_and_launcher(otmp, olaunch) &&
		   (olaunch->oprops & oprop)) {
	    olaunch->oprops_known |= oprop;
	}
}